

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O1

void __thiscall
QOpenGLExtensionsPrivate::QOpenGLExtensionsPrivate
          (QOpenGLExtensionsPrivate *this,QOpenGLContext *ctx)

{
  QOpenGLContext *context;
  _func_GLvoid_ptr_GLenum_GLenum *p_Var1;
  _func_void_GLenum_qopengl_GLintptr_qopengl_GLsizeiptr_GLvoid_ptr *p_Var2;
  _func_void_GLenum_GLsizei_GLenum_ptr *p_Var3;
  
  QOpenGLFunctionsPrivate::QOpenGLFunctionsPrivate((QOpenGLFunctionsPrivate *)this,ctx);
  QOpenGLExtraFunctionsPrivate::init(&this->super_QOpenGLExtraFunctionsPrivate,(EVP_PKEY_CTX *)ctx);
  this->flushVendorChecked = false;
  context = QOpenGLContext::currentContext();
  p_Var1 = (_func_GLvoid_ptr_GLenum_GLenum *)
           anon_unknown.dwarf_1b28eca::getProcAddress(context,"glMapBuffer");
  this->MapBuffer = p_Var1;
  p_Var2 = (_func_void_GLenum_qopengl_GLintptr_qopengl_GLsizeiptr_GLvoid_ptr *)
           anon_unknown.dwarf_1b28eca::getProcAddress(context,"glGetBufferSubData");
  this->GetBufferSubData = p_Var2;
  p_Var3 = (_func_void_GLenum_GLsizei_GLenum_ptr *)
           anon_unknown.dwarf_1b28eca::getProcAddress(context,"glDiscardFramebuffer");
  this->DiscardFramebuffer = p_Var3;
  return;
}

Assistant:

QOpenGLExtensionsPrivate::QOpenGLExtensionsPrivate(QOpenGLContext *ctx)
    : QOpenGLExtraFunctionsPrivate(ctx),
      flushVendorChecked(false)
{
    QOpenGLContext *context = QOpenGLContext::currentContext();

    MapBuffer = RESOLVE(MapBuffer);
    GetBufferSubData = RESOLVE(GetBufferSubData);
    DiscardFramebuffer = RESOLVE(DiscardFramebuffer);
}